

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O1

int av1_get_palette_cache(MACROBLOCKD *xd,int plane,uint16_t *cache)

{
  ushort uVar1;
  ushort uVar2;
  MB_MODE_INFO *pMVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint16_t *puVar8;
  PALETTE_MODE_INFO *pPVar9;
  uint uVar10;
  int iVar11;
  MB_MODE_INFO *pMVar12;
  PALETTE_MODE_INFO *pPVar13;
  
  uVar10 = 0;
  if ((-xd->mb_to_top_edge & 0x1f8U) == 0) {
    pMVar12 = (MB_MODE_INFO *)0x0;
  }
  else {
    pMVar12 = xd->above_mbmi;
  }
  pMVar3 = xd->left_mbmi;
  if (pMVar12 != (MB_MODE_INFO *)0x0) {
    uVar10 = (uint)*(byte *)((long)pMVar12 + (0x8f - (ulong)(plane == 0)));
  }
  iVar7 = 0;
  uVar6 = 0;
  if (pMVar3 != (MB_MODE_INFO *)0x0) {
    uVar6 = (uint)*(byte *)((long)pMVar3 + (0x8f - (ulong)(plane == 0)));
  }
  if (uVar10 != 0 || uVar6 != 0) {
    iVar7 = plane << 3;
    pPVar13 = &pMVar12->palette_mode_info;
    if (pMVar12 == (MB_MODE_INFO *)0x0) {
      pPVar13 = (PALETTE_MODE_INFO *)0x0;
    }
    pPVar9 = &pMVar3->palette_mode_info;
    if (pMVar3 == (MB_MODE_INFO *)0x0) {
      pPVar9 = (PALETTE_MODE_INFO *)0x0;
    }
    uVar5 = 0;
    iVar11 = iVar7;
    if ((uVar10 != 0) && (uVar6 != 0)) {
      uVar5 = 0;
      do {
        uVar1 = pPVar13->palette_colors[iVar7];
        uVar2 = pPVar9->palette_colors[iVar11];
        iVar4 = (int)uVar5;
        if (uVar2 < uVar1) {
          if ((iVar4 < 1) || (cache[uVar5 - 1] != uVar2)) {
            uVar5 = (ulong)(iVar4 + 1);
            cache[iVar4] = uVar2;
          }
LAB_0039ab21:
          iVar11 = iVar11 + 1;
          uVar6 = uVar6 - 1;
        }
        else {
          if ((iVar4 < 1) || (cache[uVar5 - 1] != uVar1)) {
            uVar5 = (ulong)(iVar4 + 1);
            cache[iVar4] = uVar1;
          }
          iVar7 = iVar7 + 1;
          uVar10 = uVar10 - 1;
          if (uVar2 == uVar1) goto LAB_0039ab21;
        }
      } while ((0 < (int)uVar10) && (0 < (int)uVar6));
    }
    if (0 < (int)uVar10) {
      puVar8 = pPVar13->palette_colors + iVar7;
      iVar7 = uVar10 + 1;
      do {
        iVar4 = (int)uVar5;
        if ((iVar4 < 1) || (cache[uVar5 - 1] != *puVar8)) {
          uVar5 = (ulong)(iVar4 + 1);
          cache[iVar4] = *puVar8;
        }
        puVar8 = puVar8 + 1;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
    }
    iVar7 = (int)uVar5;
    if (0 < (int)uVar6) {
      puVar8 = pPVar9->palette_colors + iVar11;
      iVar11 = uVar6 + 1;
      do {
        iVar7 = (int)uVar5;
        if ((iVar7 < 1) || (cache[uVar5 - 1] != *puVar8)) {
          uVar5 = (ulong)(iVar7 + 1);
          cache[iVar7] = *puVar8;
        }
        iVar7 = (int)uVar5;
        puVar8 = puVar8 + 1;
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
    }
  }
  return iVar7;
}

Assistant:

int av1_get_palette_cache(const MACROBLOCKD *const xd, int plane,
                          uint16_t *cache) {
  const int row = -xd->mb_to_top_edge >> 3;
  // Do not refer to above SB row when on SB boundary.
  const MB_MODE_INFO *const above_mi =
      (row % (1 << MIN_SB_SIZE_LOG2)) ? xd->above_mbmi : NULL;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  int above_n = 0, left_n = 0;
  if (above_mi) above_n = above_mi->palette_mode_info.palette_size[plane != 0];
  if (left_mi) left_n = left_mi->palette_mode_info.palette_size[plane != 0];
  if (above_n == 0 && left_n == 0) return 0;
  int above_idx = plane * PALETTE_MAX_SIZE;
  int left_idx = plane * PALETTE_MAX_SIZE;
  int n = 0;
  const uint16_t *above_colors =
      above_mi ? above_mi->palette_mode_info.palette_colors : NULL;
  const uint16_t *left_colors =
      left_mi ? left_mi->palette_mode_info.palette_colors : NULL;
  // Merge the sorted lists of base colors from above and left to get
  // combined sorted color cache.
  while (above_n > 0 && left_n > 0) {
    uint16_t v_above = above_colors[above_idx];
    uint16_t v_left = left_colors[left_idx];
    if (v_left < v_above) {
      palette_add_to_cache(cache, &n, v_left);
      ++left_idx, --left_n;
    } else {
      palette_add_to_cache(cache, &n, v_above);
      ++above_idx, --above_n;
      if (v_left == v_above) ++left_idx, --left_n;
    }
  }
  while (above_n-- > 0) {
    uint16_t val = above_colors[above_idx++];
    palette_add_to_cache(cache, &n, val);
  }
  while (left_n-- > 0) {
    uint16_t val = left_colors[left_idx++];
    palette_add_to_cache(cache, &n, val);
  }
  assert(n <= 2 * PALETTE_MAX_SIZE);
  return n;
}